

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O0

int Cba_NtkInsertGiaLit(Cba_Ntk_t *p,int iLit,Vec_Int_t *vLit2Fon,int fUseXor)

{
  int iVar1;
  int local_30;
  int iObjNew;
  int fUseXor_local;
  Vec_Int_t *vLit2Fon_local;
  int iLit_local;
  Cba_Ntk_t *p_local;
  
  if ((iLit == 0) || (iLit == 1)) {
    p_local._4_4_ = Cba_FonFromConst(iLit);
  }
  else {
    iVar1 = Vec_IntEntry(vLit2Fon,iLit);
    if (iVar1 < 0) {
      iVar1 = Abc_LitIsCompl(iLit);
      if (iVar1 == 0) {
        __assert_fail("Abc_LitIsCompl(iLit)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cbaNtk.c"
                      ,0x3f0,"int Cba_NtkInsertGiaLit(Cba_Ntk_t *, int, Vec_Int_t *, int)");
      }
      iVar1 = Abc_LitNot(iLit);
      iVar1 = Vec_IntEntry(vLit2Fon,iVar1);
      if (iVar1 < 0) {
        __assert_fail("Vec_IntEntry(vLit2Fon, Abc_LitNot(iLit)) >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cbaNtk.c"
                      ,0x3f1,"int Cba_NtkInsertGiaLit(Cba_Ntk_t *, int, Vec_Int_t *, int)");
      }
      if (fUseXor == 0) {
        local_30 = Cba_ObjAlloc(p,CBA_BOX_INV,1,1);
        iVar1 = Abc_LitNot(iLit);
        iVar1 = Vec_IntEntry(vLit2Fon,iVar1);
        Cba_ObjSetFinFon(p,local_30,0,iVar1);
      }
      else {
        local_30 = Cba_ObjAlloc(p,CBA_BOX_XOR,2,1);
        iVar1 = Abc_LitNot(iLit);
        iVar1 = Vec_IntEntry(vLit2Fon,iVar1);
        Cba_ObjSetFinFon(p,local_30,0,iVar1);
        iVar1 = Cba_FonFromConst(1);
        Cba_ObjSetFinFon(p,local_30,1,iVar1);
      }
      iVar1 = Cba_ObjFon0(p,local_30);
      Vec_IntWriteEntry(vLit2Fon,iLit,iVar1);
      p_local._4_4_ = Cba_ObjFon0(p,local_30);
    }
    else {
      p_local._4_4_ = Vec_IntEntry(vLit2Fon,iLit);
    }
  }
  return p_local._4_4_;
}

Assistant:

static inline int Cba_NtkInsertGiaLit( Cba_Ntk_t * p, int iLit, Vec_Int_t * vLit2Fon, int fUseXor )
{
    int iObjNew;
    if ( iLit == 0 || iLit == 1 )
        return Cba_FonFromConst(iLit);
    if ( Vec_IntEntry(vLit2Fon, iLit) >= 0 )
        return Vec_IntEntry(vLit2Fon, iLit);
    assert( Abc_LitIsCompl(iLit) );
    assert( Vec_IntEntry(vLit2Fon, Abc_LitNot(iLit)) >= 0 );
    // create inverter
    if ( fUseXor )
    {
        iObjNew = Cba_ObjAlloc( p, CBA_BOX_XOR, 2, 1 );
        Cba_ObjSetFinFon( p, iObjNew, 0, Vec_IntEntry(vLit2Fon, Abc_LitNot(iLit)) );
        Cba_ObjSetFinFon( p, iObjNew, 1, Cba_FonFromConst(1) );
    }
    else
    {
        iObjNew = Cba_ObjAlloc( p, CBA_BOX_INV, 1, 1 );
        Cba_ObjSetFinFon( p, iObjNew, 0, Vec_IntEntry(vLit2Fon, Abc_LitNot(iLit)) );
    }
    // save the result
    Vec_IntWriteEntry( vLit2Fon, iLit, Cba_ObjFon0(p, iObjNew) );
    return Cba_ObjFon0(p, iObjNew);
}